

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

char * vkt::sr::anon_unknown_0::getIndexAccessTypeName(IndexAccessType accessType)

{
  IndexAccessType accessType_local;
  
  return getIndexAccessTypeName::s_names[(int)accessType];
}

Assistant:

static const char* getIndexAccessTypeName (IndexAccessType accessType)
{
	static const char* s_names[INDEXACCESS_LAST] =
	{
		"static",
		"dynamic",
		"static_loop",
		"dynamic_loop"
	};

	DE_ASSERT(deInBounds32((int)accessType, 0, INDEXACCESS_LAST));
	return s_names[(int)accessType];
}